

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O2

ssize_t __thiscall DNSResolver::send(DNSResolver *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int __fd_00;
  size_t sVar1;
  int *piVar2;
  
  __fd_00 = this->sockfd;
  sVar1 = strlen((char *)this->qname);
  piVar2 = (int *)::send(__fd_00,this,sVar1 + 0x11,0);
  if ((long)piVar2 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      this->drop = true;
    }
  }
  else {
    this->requestSended = true;
  }
  return (ssize_t)piVar2;
}

Assistant:

void DNSResolver::send() {
    if (::send(sockfd, (char *) buf,
               sizeof(struct DNS_HEADER) + (strlen((const char *) qname) + 1) + sizeof(struct QUESTION), 0) < 0) {
        if (errno != EWOULDBLOCK) {
            drop = true;
        }
        return;
    }
    requestSended = true;
}